

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O0

apx_error_t create_definition_file_info(apx_nodeInstance_t *self,rmf_fileInfo_t *file_info)

{
  apx_size_t size;
  apx_size_t aVar1;
  apx_error_t aVar2;
  uint8_t *input;
  uint8_t local_138 [4];
  uint32_t file_size;
  uint8_t digest_data [32];
  char file_name [256];
  rmf_fileInfo_t *file_info_local;
  apx_nodeInstance_t *self_local;
  
  if (self->node_data != (apx_nodeData_t *)0x0) {
    size = apx_nodeData_definition_data_size(self->node_data);
    strcpy((char *)(digest_data + 0x18),self->name);
    strcat((char *)(digest_data + 0x18),".apx");
    input = apx_nodeInstance_get_definition_data(self);
    aVar1 = apx_nodeInstance_get_definition_size(self);
    sha256_calc(local_138,input,(ulong)aVar1);
    aVar2 = rmf_fileInfo_create(file_info,0x7fffffff,size,(char *)(digest_data + 0x18),'\0','\x02',
                                local_138);
    return aVar2;
  }
  __assert_fail("self->node_data != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_instance.c"
                ,0x46b,
                "apx_error_t create_definition_file_info(apx_nodeInstance_t *, rmf_fileInfo_t *)");
}

Assistant:

static apx_error_t create_definition_file_info(apx_nodeInstance_t* self, rmf_fileInfo_t* file_info)
{
   assert(self->node_data != NULL);
   char file_name[RMF_MAX_FILE_NAME_SIZE + 1];
   uint8_t digest_data[RMF_SHA256_SIZE];
   uint32_t file_size = (uint32_t) apx_nodeData_definition_data_size(self->node_data);
   strcpy(file_name, self->name);
   strcat(file_name, ".apx");

   sha256_calc(&digest_data[0], apx_nodeInstance_get_definition_data(self), (size_t)apx_nodeInstance_get_definition_size(self));
   return rmf_fileInfo_create(file_info, RMF_INVALID_ADDRESS, file_size, file_name,
      RMF_FILE_TYPE_FIXED, RMF_DIGEST_TYPE_SHA256, &digest_data[0]);
}